

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

CaseStatementSyntax * __thiscall
slang::parsing::Parser::parseCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority,
          Token caseKeyword)

{
  Token caseKeyword_00;
  bool bVar1;
  TokenKind TVar2;
  undefined1 tripleAnd [16];
  bool bVar3;
  int iVar5;
  ExpressionSyntax *expr;
  byte bVar4;
  PatternSyntax *pattern;
  ExpressionSyntax *pEVar6;
  StatementSyntax *pSVar7;
  PatternCaseItemSyntax *pPVar8;
  DefaultCaseItemSyntax *pDVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StandardCaseItemSyntax *pSVar10;
  SourceLocation SVar11;
  Diagnostic *pDVar12;
  undefined4 extraout_var_01;
  CaseStatementSyntax *pCVar13;
  Info *pIVar14;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *pIVar15;
  TokenKind TVar16;
  TokenKind TVar17;
  TokenKind TVar18;
  ulong uVar19;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *p_Var20;
  Token openParen;
  Token closeParen;
  Token TVar21;
  string_view sVar22;
  Token TVar23;
  SourceLocation local_278;
  Token local_268;
  SyntaxFactory *local_258;
  Info *local_250;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_248;
  ulong local_238;
  undefined8 uStack_230;
  undefined8 local_220;
  Token local_210;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expr = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  Token::Token(&local_210);
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.data_ =
       (pointer)itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.firstElement;
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.len = 0;
  itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.cap = 5;
  TVar21 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = caseKeyword.kind;
  if (TVar21.kind == InsideKeyword) {
    local_210 = ParserBase::consume(&this->super_ParserBase);
    TVar2 = caseKeyword.kind;
    local_258 = &this->factory;
    local_278 = (SourceLocation)0x0;
    bVar1 = false;
    do {
      while( true ) {
        while( true ) {
          TVar21 = ParserBase::peek(&this->super_ParserBase);
          TVar17 = TVar21.kind;
          if (TVar17 != DefaultKeyword) break;
          if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
            buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
                 ParserBase::peek(&this->super_ParserBase);
            SVar11 = Token::location((Token *)&buffer);
            pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
            sVar22 = LexerFacts::getTokenKindText(TVar2);
            Diagnostic::operator<<(pDVar12,sVar22);
            bVar1 = true;
            Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_278);
          }
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::peek(&this->super_ParserBase);
          local_278 = Token::location((Token *)&buffer);
          pDVar9 = parseDefaultCaseItem(this);
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pDVar9;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                     (CaseItemSyntax **)&buffer);
        }
        bVar3 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TVar17);
        if (!bVar3) break;
        Token::Token(&local_268);
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
             (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
        local_250 = TVar21.info;
        TVar21 = ParserBase::peek(&this->super_ParserBase);
        current = TVar21;
        bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar21.kind);
        if (bVar3) {
          bVar3 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar3) {
            SVar11 = Token::location(&current);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,SVar11);
          }
          local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_002bebe8:
          pIVar15 = local_268.info;
        }
        else {
          bVar3 = slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TVar21.kind);
          if (bVar3) {
            do {
              do {
                pIVar15 = TVar21.info;
                pEVar6 = parseValueRangeElement
                                   (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
                local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar6;
                local_238 = CONCAT71(local_238._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (TokenOrSyntax *)&local_248._M_first);
                TVar23 = ParserBase::peek(&this->super_ParserBase);
                TVar16 = TVar23.kind;
                bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar16);
                if (TVar16 == EndOfFile || bVar3) goto LAB_002bebdd;
                if (TVar16 != Comma) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar3 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                      (&this->super_ParserBase,(DiagCode)0x580005,false);
                    if (!bVar3) {
                      local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
                      goto LAB_002bebe8;
                    }
                    bVar3 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar3);
                }
                local_248._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_238 = local_238 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (TokenOrSyntax *)&local_248._M_first);
                TVar23 = ParserBase::peek(&this->super_ParserBase);
                pIVar14 = TVar23.info;
                TVar16 = TVar23.kind;
                bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar16);
                if (TVar16 == EndOfFile || bVar3) {
                  ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                  goto LAB_002bebdd;
                }
                TVar18 = TVar21.kind;
                uVar19 = TVar23._0_8_ & 0xffffffff;
                TVar21.info = pIVar14;
                TVar21.kind = (short)uVar19;
                TVar21._2_1_ = (char)(uVar19 >> 0x10);
                TVar21.numFlags.raw = (char)(uVar19 >> 0x18);
                TVar21.rawLen = (int)(uVar19 >> 0x20);
              } while (pIVar15 != pIVar14 || TVar18 != TVar16);
              bVar3 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                (&this->super_ParserBase,(DiagCode)0x580005,true);
              uVar19 = TVar23._0_8_ & 0xffffffff;
              TVar21.kind = (short)uVar19;
              TVar21._2_1_ = (char)(uVar19 >> 0x10);
              TVar21.numFlags.raw = (char)(uVar19 >> 0x18);
              TVar21.rawLen = (int)(uVar19 >> 0x20);
            } while (bVar3);
LAB_002bebdd:
            local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
            goto LAB_002bebe8;
          }
          ParserBase::reportMissingList
                    (&this->super_ParserBase,TVar21,Colon,&local_268,(DiagCode)0x580005);
          pIVar15 = extraout_RDX;
        }
        iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar15);
        TVar21 = local_268;
        local_220 = CONCAT44(extraout_var,iVar5);
        local_248._8_4_ = 3;
        local_238 = 0;
        uStack_230 = 0;
        local_248._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a38f0;
        pSVar7 = parseStatement(this,true,false);
        p_Var20 = &local_248;
        pSVar10 = slang::syntax::SyntaxFactory::standardCaseItem
                            (local_258,
                             (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                             &p_Var20->_M_first,TVar21,&pSVar7->super_SyntaxNode);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (EVP_PKEY_CTX *)&p_Var20->_M_first);
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar10;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                   (CaseItemSyntax **)&buffer);
        pIVar15 = local_250;
        TVar21 = ParserBase::peek(&this->super_ParserBase);
        if (pIVar15 == TVar21.info && TVar17 == TVar21.kind) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      if ((TVar17 == EndOfFile) || (bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(TVar17), bVar3)
         ) goto LAB_002bf14b;
      bVar4 = ~bVar1;
      bVar1 = true;
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar4 << 0x20 | 0x310005));
    } while( true );
  }
  if (TVar21.kind == MatchesKeyword) {
    local_210 = ParserBase::consume(&this->super_ParserBase);
    TVar2 = caseKeyword.kind;
    local_258 = &this->factory;
    local_278 = (SourceLocation)0x0;
    bVar1 = false;
    while( true ) {
      while( true ) {
        while( true ) {
          TVar21 = ParserBase::peek(&this->super_ParserBase);
          local_250 = TVar21.info;
          TVar17 = TVar21.kind;
          if (TVar17 != DefaultKeyword) break;
          if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
            buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
                 ParserBase::peek(&this->super_ParserBase);
            SVar11 = Token::location((Token *)&buffer);
            pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
            sVar22 = LexerFacts::getTokenKindText(TVar2);
            Diagnostic::operator<<(pDVar12,sVar22);
            bVar1 = true;
            Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_278);
          }
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::peek(&this->super_ParserBase);
          local_278 = Token::location((Token *)&buffer);
          pDVar9 = parseDefaultCaseItem(this);
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pDVar9;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                     (CaseItemSyntax **)&buffer);
        }
        bVar3 = slang::syntax::SyntaxFacts::isPossiblePattern(TVar17);
        if (!bVar3) break;
        pattern = parsePattern(this);
        Token::Token((Token *)&buffer);
        bVar3 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
        if (bVar3) {
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::consume(&this->super_ParserBase);
          pEVar6 = parseExpression(this);
        }
        else {
          pEVar6 = (ExpressionSyntax *)0x0;
        }
        local_248._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Colon);
        tripleAnd = (undefined1  [16])
                    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_;
        pSVar7 = parseStatement(this,true,false);
        pPVar8 = slang::syntax::SyntaxFactory::patternCaseItem
                           (local_258,pattern,(Token)tripleAnd,pEVar6,
                            (Token)local_248._M_first._M_storage,pSVar7);
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pPVar8;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                   (CaseItemSyntax **)&buffer);
        TVar21 = ParserBase::peek(&this->super_ParserBase);
        if (local_250 == TVar21.info && TVar17 == TVar21.kind) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
      }
      if ((TVar17 == EndOfFile) || (bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(TVar17), bVar3)
         ) break;
      bVar4 = ~bVar1;
      bVar1 = true;
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar4 << 0x20 | 0x310005));
    }
LAB_002bf14b:
    if (itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>.len == 0 && !bVar1) {
      SVar11 = Token::location(&caseKeyword);
      pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x50005,SVar11);
      sVar22 = LexerFacts::getTokenKindText(caseKeyword.kind);
      Diagnostic::operator<<(pDVar12,sVar22);
    }
    TVar23 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
    TVar21 = local_210;
    pIVar15 = caseKeyword.info;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 1;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_006a3268;
    caseKeyword_00._2_1_ = caseKeyword._2_1_;
    caseKeyword_00.numFlags.raw = caseKeyword.numFlags.raw;
    caseKeyword_00.rawLen = caseKeyword.rawLen;
    caseKeyword_00.kind = caseKeyword.kind;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
         attributes._M_extent._M_extent_value._M_extent_value;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ =
         attributes._M_ptr;
    buffer.stackBase._0_8_ = attributes._M_extent._M_extent_value._M_extent_value;
    iVar5 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                      (&itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar23.info);
    local_220 = CONCAT44(extraout_var_01,iVar5);
    local_248._8_4_ = 1;
    local_238 = 0;
    uStack_230 = 0;
    local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a3700;
    caseKeyword_00.info = pIVar15;
    pCVar13 = slang::syntax::SyntaxFactory::caseStatement
                        (&this->factory,label,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&buffer,
                         uniqueOrPriority,caseKeyword_00,openParen,expr,closeParen,TVar21,
                         (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_248._M_first,TVar23);
    SmallVectorBase<slang::syntax::CaseItemSyntax_*>::cleanup
              (&itemBuffer.super_SmallVectorBase<slang::syntax::CaseItemSyntax_*>,
               (EVP_PKEY_CTX *)label);
    return pCVar13;
  }
  local_258 = &this->factory;
  local_278 = (SourceLocation)0x0;
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        TVar21 = ParserBase::peek(&this->super_ParserBase);
        TVar17 = TVar21.kind;
        if (TVar17 != DefaultKeyword) break;
        if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
          buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::peek(&this->super_ParserBase);
          SVar11 = Token::location((Token *)&buffer);
          pDVar12 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar11);
          sVar22 = LexerFacts::getTokenKindText(TVar2);
          Diagnostic::operator<<(pDVar12,sVar22);
          bVar1 = true;
          Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_278);
        }
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
             ParserBase::peek(&this->super_ParserBase);
        local_278 = Token::location((Token *)&buffer);
        pDVar9 = parseDefaultCaseItem(this);
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pDVar9;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                   (CaseItemSyntax **)&buffer);
      }
      bVar3 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar17);
      if (!bVar3) break;
      Token::Token(&local_268);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
      local_250 = TVar21.info;
      TVar23 = ParserBase::peek(&this->super_ParserBase);
      current = TVar23;
      bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar23.kind);
      if (bVar3) {
        bVar3 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar3) {
          SVar11 = Token::location(&current);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar11);
        }
        local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_002bf059:
        pIVar15 = local_268.info;
      }
      else {
        bVar3 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar23.kind);
        if (bVar3) {
          do {
            do {
              pIVar15 = TVar23.info;
              pEVar6 = parseExpression(this);
              local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar6;
              local_238 = CONCAT71(local_238._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_248._M_first);
              TVar21 = ParserBase::peek(&this->super_ParserBase);
              TVar16 = TVar21.kind;
              bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar16);
              if (TVar16 == EndOfFile || bVar3) goto LAB_002bf04e;
              if (TVar16 != Comma) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar3 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                    (&this->super_ParserBase,(DiagCode)0x10001,false);
                  if (!bVar3) {
                    local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
                    goto LAB_002bf059;
                  }
                  bVar3 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar3);
              }
              local_248._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_238 = local_238 & 0xffffffffffffff00;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_248._M_first);
              TVar21 = ParserBase::peek(&this->super_ParserBase);
              pIVar14 = TVar21.info;
              TVar16 = TVar21.kind;
              bVar3 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar16);
              if (TVar16 == EndOfFile || bVar3) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                goto LAB_002bf04e;
              }
              TVar18 = TVar23.kind;
              uVar19 = TVar21._0_8_ & 0xffffffff;
              TVar23.info = pIVar14;
              TVar23.kind = (short)uVar19;
              TVar23._2_1_ = (char)(uVar19 >> 0x10);
              TVar23.numFlags.raw = (char)(uVar19 >> 0x18);
              TVar23.rawLen = (int)(uVar19 >> 0x20);
            } while (pIVar15 != pIVar14 || TVar18 != TVar16);
            bVar3 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                              (&this->super_ParserBase,(DiagCode)0x10001,true);
            uVar19 = TVar21._0_8_ & 0xffffffff;
            TVar23.kind = (short)uVar19;
            TVar23._2_1_ = (char)(uVar19 >> 0x10);
            TVar23.numFlags.raw = (char)(uVar19 >> 0x18);
            TVar23.rawLen = (int)(uVar19 >> 0x20);
          } while (bVar3);
LAB_002bf04e:
          local_268 = ParserBase::expect(&this->super_ParserBase,Colon);
          goto LAB_002bf059;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar23,Colon,&local_268,(DiagCode)0x10001);
        pIVar15 = extraout_RDX_00;
      }
      iVar5 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar15);
      TVar21 = local_268;
      local_220 = CONCAT44(extraout_var_00,iVar5);
      local_248._8_4_ = 3;
      local_238 = 0;
      uStack_230 = 0;
      local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a38f0
      ;
      pSVar7 = parseStatement(this,true,false);
      p_Var20 = &local_248;
      pSVar10 = slang::syntax::SyntaxFactory::standardCaseItem
                          (local_258,
                           (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                           &p_Var20->_M_first,TVar21,&pSVar7->super_SyntaxNode);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (EVP_PKEY_CTX *)&p_Var20->_M_first);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pSVar10;
      SmallVectorBase<slang::syntax::CaseItemSyntax*>::emplace_back<slang::syntax::CaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)&itemBuffer,
                 (CaseItemSyntax **)&buffer);
      pIVar15 = local_250;
      TVar21 = ParserBase::peek(&this->super_ParserBase);
      if (pIVar15 == TVar21.info && TVar17 == TVar21.kind) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
    }
    if ((TVar17 == EndOfFile) || (bVar3 = slang::syntax::SyntaxFacts::isEndKeyword(TVar17), bVar3))
    goto LAB_002bf14b;
    bVar4 = ~bVar1;
    bVar1 = true;
    ParserBase::skipToken
              (&this->super_ParserBase,(optional<slang::DiagCode>)((uint6)bVar4 << 0x20 | 0x310005))
    ;
  } while( true );
}

Assistant:

CaseStatementSyntax& Parser::parseCaseStatement(NamedLabelSyntax* label, AttrList attributes,
                                                Token uniqueOrPriority, Token caseKeyword) {
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& caseExpr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    Token matchesOrInside;
    SmallVector<CaseItemSyntax*> itemBuffer;
    bool errored = false;

    switch (peek().kind) {
        case TokenKind::MatchesKeyword:
            // pattern matching case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossiblePattern(kind); },
                [this] {
                    auto& pattern = parsePattern();
                    Token tripleAnd;
                    ExpressionSyntax* patternExpr = nullptr;

                    if (peek(TokenKind::TripleAnd)) {
                        tripleAnd = consume();
                        patternExpr = &parseExpression();
                    }

                    auto colon = expect(TokenKind::Colon);
                    return &factory.patternCaseItem(pattern, tripleAnd, patternExpr, colon,
                                                    parseStatement());
                });
            break;
        case TokenKind::InsideKeyword:
            // range checking case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer,
                [](auto kind) { return isPossibleValueRangeElement(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleValueRangeElement, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedValueRangeElement,
                        [this] { return &parseValueRangeElement(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
        default:
            // normal case statement
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossibleExpression(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedExpression, [this] { return &parseExpression(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
    }

    if (itemBuffer.empty() && !errored) {
        addDiag(diag::CaseStatementEmpty, caseKeyword.location())
            << LexerFacts::getTokenKindText(caseKeyword.kind);
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseStatement(label, attributes, uniqueOrPriority, caseKeyword, openParen,
                                 caseExpr, closeParen, matchesOrInside, itemBuffer.copy(alloc),
                                 endcase);
}